

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

ly_bool lyds_is_supported(lyd_node *node)

{
  lyd_node *node_local;
  
  if ((node->schema == (lysc_node *)0x0) || ((node->schema->flags & 0x80) == 0)) {
    node_local._7_1_ = '\0';
  }
  else if (node->schema->nodetype == 8) {
    node_local._7_1_ = '\x01';
  }
  else if ((node->schema->nodetype == 0x10) && ((node->schema->flags & 0x200) == 0)) {
    node_local._7_1_ = '\x01';
  }
  else {
    node_local._7_1_ = '\0';
  }
  return node_local._7_1_;
}

Assistant:

ly_bool
lyds_is_supported(const struct lyd_node *node)
{
    if (!node->schema || !(node->schema->flags & LYS_ORDBY_SYSTEM)) {
        return 0;
    } else if (node->schema->nodetype == LYS_LEAFLIST) {
        return 1;
    } else if ((node->schema->nodetype == LYS_LIST) && !(node->schema->flags & LYS_KEYLESS)) {
        return 1;
    } else {
        return 0;
    }
}